

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# japancal.cpp
# Opt level: O0

void icu_63::initializeEras(UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  char *str1;
  char *envVarVal;
  UBool includeTentativeEra;
  UErrorCode *status_local;
  
  envVarVal._7_1_ = '\0';
  str1 = getenv(TENTATIVE_ERA_VAR_NAME);
  if ((str1 != (char *)0x0) && (iVar2 = uprv_stricmp_63(str1,"true"), iVar2 == 0)) {
    envVarVal._7_1_ = '\x01';
  }
  gJapaneseEraRules = EraRules::createInstance("japanese",envVarVal._7_1_,status);
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    gCurrentEra = EraRules::getCurrentEraIndex(gJapaneseEraRules);
  }
  return;
}

Assistant:

static void U_CALLCONV initializeEras(UErrorCode &status) {
    // Although start date of next Japanese era is planned ahead, a name of
    // new era might not be available. This implementation allows tester to
    // check a new era without era names by settings below (in priority order).
    // By default, such tentative era is disabled.

    // 1. Environment variable ICU_ENABLE_TENTATIVE_ERA=true or false

    UBool includeTentativeEra = FALSE;

#if U_PLATFORM_HAS_WINUWP_API == 1
    // UWP doesn't allow access to getenv(), but we can call GetEnvironmentVariableW to do the same thing.
    UChar varName[26] = {};
    u_charsToUChars(TENTATIVE_ERA_VAR_NAME, varName, static_cast<int32_t>(uprv_strlen(TENTATIVE_ERA_VAR_NAME)));
    WCHAR varValue[5] = {};
    DWORD ret = GetEnvironmentVariableW(reinterpret_cast<WCHAR*>(varName), varValue, UPRV_LENGTHOF(varValue));
    if ((ret == 4) && (_wcsicmp(varValue, L"true") == 0)) {
        includeTentativeEra = TRUE;
    }
#else
    char *envVarVal = getenv(TENTATIVE_ERA_VAR_NAME);
    if (envVarVal != NULL && uprv_stricmp(envVarVal, "true") == 0) {
        includeTentativeEra = TRUE;
    }
#endif
    gJapaneseEraRules = EraRules::createInstance("japanese", includeTentativeEra, status);
    if (U_FAILURE(status)) {
        return;
    }
    gCurrentEra = gJapaneseEraRules->getCurrentEraIndex();
}